

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloatFormat.cpp
# Opt level: O0

double __thiscall
tcu::FloatFormat::roundOut(FloatFormat *this,double d,bool upward,bool roundUnderOverflow)

{
  double dVar1;
  double dVar2;
  int local_28;
  byte local_22;
  byte local_21;
  int exp;
  bool roundUnderOverflow_local;
  bool upward_local;
  double d_local;
  FloatFormat *this_local;
  
  local_28 = 0;
  local_22 = roundUnderOverflow;
  local_21 = upward;
  _exp = d;
  d_local = (double)this;
  deFractExp(d,&local_28);
  if ((((local_22 & 1) == 0) || (local_28 <= this->m_maxExp)) ||
     ((bool)(local_21 & 1) != _exp < 0.0)) {
    this_local = (FloatFormat *)round(this,_exp);
  }
  else {
    dVar1 = deSign(_exp);
    dVar2 = getMaxValue(this);
    this_local = (FloatFormat *)(dVar1 * dVar2);
  }
  return (double)this_local;
}

Assistant:

double FloatFormat::roundOut (double d, bool upward, bool roundUnderOverflow) const
{
	int	exp	= 0;
	deFractExp(d, &exp);

	if (roundUnderOverflow && exp > m_maxExp && (upward == (d < 0.0)))
		return deSign(d) * getMaxValue();
	else
		return round(d, upward);
}